

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

__m256i * x_convolve_8tap_avx2
                    (__m256i *__return_storage_ptr__,__m256i data,__m256i *coeffs,__m256i *filt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i *in_RAX;
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  
  auVar4 = in_ZMM0._0_32_;
  auVar1 = vpshufb_avx2(auVar4,(undefined1  [32])*coeffs);
  auVar2 = vpshufb_avx2(auVar4,(undefined1  [32])coeffs[1]);
  auVar3 = vpshufb_avx2(auVar4,(undefined1  [32])coeffs[2]);
  auVar4 = vpshufb_avx2(auVar4,(undefined1  [32])coeffs[3]);
  auVar1 = vpmaddubsw_avx2(auVar1,(undefined1  [32])*__return_storage_ptr__);
  auVar2 = vpmaddubsw_avx2(auVar2,(undefined1  [32])__return_storage_ptr__[1]);
  auVar3 = vpmaddubsw_avx2(auVar3,(undefined1  [32])__return_storage_ptr__[2]);
  auVar4 = vpmaddubsw_avx2(auVar4,(undefined1  [32])__return_storage_ptr__[3]);
  auVar1 = vpaddw_avx2(auVar2,auVar1);
  auVar2 = vpaddw_avx2(auVar3,auVar4);
  vpaddw_avx2(auVar1,auVar2);
  return in_RAX;
}

Assistant:

static inline __m256i x_convolve_8tap_avx2(const __m256i data,
                                           const __m256i coeffs[4],
                                           const __m256i filt[4]) {
  __m256i ss[4];

  ss[0] = _mm256_shuffle_epi8(data, filt[0]);
  ss[1] = _mm256_shuffle_epi8(data, filt[1]);
  ss[2] = _mm256_shuffle_epi8(data, filt[2]);
  ss[3] = _mm256_shuffle_epi8(data, filt[3]);

  return convolve_8tap_avx2(ss, coeffs);
}